

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model_test.cc
# Opt level: O2

void __thiscall
gtest_suite_NoiseModelUpdateTest_::
UpdateFailsNoFlatBlocks<BitDepthParams<unsigned_short,_10,_true>_>::~UpdateFailsNoFlatBlocks
          (UpdateFailsNoFlatBlocks<BitDepthParams<unsigned_short,_10,_true>_> *this)

{
  NoiseModelUpdateTest<BitDepthParams<unsigned_short,_10,_true>_>::~NoiseModelUpdateTest
            (&this->super_NoiseModelUpdateTest<BitDepthParams<unsigned_short,_10,_true>_>);
  operator_delete(this);
  return;
}

Assistant:

TYPED_TEST_P(NoiseModelUpdateTest, UpdateFailsNoFlatBlocks) {
  EXPECT_EQ(AOM_NOISE_STATUS_INSUFFICIENT_FLAT_BLOCKS,
            this->NoiseModelUpdate());
}